

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

int Saig_ManBmcTerSimCount01Po(Aig_Man_t *p,uint *pInfo)

{
  void *pvVar1;
  int i;
  int iVar2;
  
  iVar2 = 0;
  for (i = 0; i < p->nTruePos; i = i + 1) {
    pvVar1 = Vec_PtrEntry(p->vCos,i);
    iVar2 = (iVar2 + 1) -
            (uint)((~(pInfo[*(int *)((long)pvVar1 + 0x24) >> 4] >>
                     ((char)*(int *)((long)pvVar1 + 0x24) * '\x02' & 0x1fU)) & 3) == 0);
  }
  return iVar2;
}

Assistant:

int Saig_ManBmcTerSimCount01Po( Aig_Man_t * p, unsigned * pInfo )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Saig_ManForEachPo( p, pObj, i )
        Counter += (Saig_ManBmcSimInfoGet(pInfo, pObj) != SAIG_TER_UND);
    return Counter;
}